

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O3

int msr_sys_read(raplcap_msr_sys_ctx *ctx,uint64_t *msrval,uint32_t pkg,uint32_t die,off_t msr)

{
  ssize_t sVar1;
  uint uVar2;
  
  if (ctx == (raplcap_msr_sys_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,299,
                  "int msr_sys_read(const raplcap_msr_sys_ctx *, uint64_t *, uint32_t, uint32_t, off_t)"
                 );
  }
  if (msr < 0) {
    __assert_fail("msr >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,300,
                  "int msr_sys_read(const raplcap_msr_sys_ctx *, uint64_t *, uint32_t, uint32_t, off_t)"
                 );
  }
  if (msrval == (uint64_t *)0x0) {
    __assert_fail("msrval != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0x12d,
                  "int msr_sys_read(const raplcap_msr_sys_ctx *, uint64_t *, uint32_t, uint32_t, off_t)"
                 );
  }
  uVar2 = pkg * ctx->n_die + die;
  if (uVar2 < ctx->n_fds) {
    sVar1 = pread(ctx->fds[uVar2],msrval,8,msr);
    return -(uint)(sVar1 != 8);
  }
  __assert_fail("(pkg * ctx->n_die) + die < ctx->n_fds",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                ,0x12e,
                "int msr_sys_read(const raplcap_msr_sys_ctx *, uint64_t *, uint32_t, uint32_t, off_t)"
               );
}

Assistant:

int msr_sys_read(const raplcap_msr_sys_ctx* ctx, uint64_t* msrval, uint32_t pkg, uint32_t die, off_t msr) {
  assert(ctx);
  assert(msr >= 0);
  assert(msrval != NULL);
  assert((pkg * ctx->n_die) + die < ctx->n_fds);
  if (pread(ctx->fds[(pkg * ctx->n_die) + die], msrval, sizeof(uint64_t), msr) == sizeof(uint64_t)) {
    raplcap_log(DEBUG, "msr_sys_read: msr=0x%lX, msrval=0x%016lX\n", msr, *msrval);
    return 0;
  }
  raplcap_log(DEBUG, "msr_sys_read(0x%lX): pread: %s\n", msr, strerror(errno));
  return -1;
}